

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase90::run(TestCase90 *this)

{
  ArrayPtr<kj::String> argValues;
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  *params;
  TestObject **params_00;
  TestObject **params_01;
  long lVar1;
  String *pSStack_f8;
  Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> obj2;
  Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> obj1;
  ObjectHeader *local_d0;
  ChunkHeader *local_c8;
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  _kjCondition;
  DebugComparison<int,_int_&> _kjCondition_1;
  String local_68;
  String local_50;
  Arena arena;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  Arena::Arena(&arena,0x400);
  Arena::allocateOwn<kj::(anonymous_namespace)::TestObject>((Arena *)&obj1);
  Arena::allocateOwn<kj::(anonymous_namespace)::TestObject>((Arena *)&obj2);
  _kjCondition.result = obj1.ptr < obj2.ptr;
  _kjCondition.left = obj1.ptr;
  _kjCondition.right = obj2.ptr;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  if (kj::_::Debug::minSeverity < 3 && !_kjCondition.result) {
    local_c8 = (ChunkHeader *)obj1.ptr;
    local_d0 = (ObjectHeader *)obj2.ptr;
    str<char_const(&)[45]>
              ((String *)&_kjCondition_1,(kj *)"failed: expected (obj1.get()) < (obj2.get())",
               (char (*) [45])obj2.ptr);
    str<kj::_::DebugComparison<kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>&>
              ((String *)&_kjCondition_1.op.content.size_,(kj *)&_kjCondition,params);
    str<kj::(anonymous_namespace)::TestObject*&>(&local_68,(kj *)&local_c8,params_00);
    str<kj::(anonymous_namespace)::TestObject*&>(&local_50,(kj *)&local_d0,params_01);
    argValues.size_ = (size_t)obj2.disposer;
    argValues.ptr = pSStack_f8;
    kj::_::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,(char *)0x63,2,0x400844,(char *)&_kjCondition_1,argValues);
    lVar1 = 0x48;
    do {
      Array<char>::~Array((Array<char> *)((long)&_kjCondition_1.left + lVar1));
      lVar1 = lVar1 + -0x18;
    } while (lVar1 != -0x18);
  }
  _kjCondition_1.result = (anonymous_namespace)::TestObject::count == 2;
  _kjCondition_1.left = 2;
  _kjCondition_1.right = &(anonymous_namespace)::TestObject::count;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  if ((!_kjCondition_1.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.left = (TestObject *)CONCAT44(_kjCondition.left._4_4_,2);
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"(2) == (TestObject::count)\", _kjCondition, 2, TestObject::count"
               ,(char (*) [44])"failed: expected (2) == (TestObject::count)",&_kjCondition_1,
               (int *)&_kjCondition,&(anonymous_namespace)::TestObject::count);
  }
  if (obj2.ptr != (TestObject *)0x0) {
    obj2.ptr = (TestObject *)0x0;
    (**(obj2.disposer)->_vptr_Disposer)();
  }
  if (obj1.ptr != (TestObject *)0x0) {
    obj1.ptr = (TestObject *)0x0;
    (**(obj1.disposer)->_vptr_Disposer)();
  }
  _kjCondition_1.left = 0;
  _kjCondition_1.result = (anonymous_namespace)::TestObject::count == 0;
  _kjCondition_1.right = &(anonymous_namespace)::TestObject::count;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  if ((!_kjCondition_1.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.left = (TestObject *)((ulong)_kjCondition.left & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x68,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
               ,(char (*) [44])"failed: expected (0) == (TestObject::count)",&_kjCondition_1,
               (int *)&_kjCondition,&(anonymous_namespace)::TestObject::count);
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, OwnObject) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Arena arena;

  {
    Own<TestObject> obj1 = arena.allocateOwn<TestObject>();
    Own<TestObject> obj2 = arena.allocateOwn<TestObject>();
    EXPECT_LT(obj1.get(), obj2.get());

    EXPECT_EQ(2, TestObject::count);
  }

  EXPECT_EQ(0, TestObject::count);
}